

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O3

void __thiscall denialofservice_tests::peer_discouragement::test_method(peer_discouragement *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AddrMan *addrman_in;
  NetGroupManager *netgroupman;
  Options opts;
  path ban_file;
  CNode *pCVar2;
  char cVar3;
  bool bVar4;
  ChainstateManager *pCVar5;
  CChainParams *pCVar6;
  CConnman *this_00;
  CNode *pCVar7;
  long lVar8;
  iterator pvVar9;
  CTxMemPool *warnings;
  iterator pvVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  shared_ptr<Sock> sock;
  shared_ptr<Sock> sock_00;
  shared_ptr<Sock> sock_01;
  __single_object connman;
  __single_object banman;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock32;
  array<CNode_*,_3UL> nodes;
  array<CAddress,_3UL> addr;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  check_type cVar13;
  undefined8 in_stack_fffffffffffff8d0;
  CAddress *pCVar11;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  uint uVar12;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  undefined1 in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8e9;
  CNodeOptions *node_opts;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 local_5b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 local_3c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 local_2f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 local_2b8 [16];
  unique_ptr<BanMan,_std::default_delete<BanMan>_> local_2a8;
  char *local_2a0;
  unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> local_298;
  __atomic_base<unsigned_long> _Stack_290;
  uint64_t local_288;
  undefined1 local_280;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined2 uStack_26c;
  undefined2 uStack_26a;
  unique_lock<std::mutex> local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  direct_or_indirect local_238;
  undefined1 *local_228;
  CAddress *local_220;
  undefined8 local_210;
  AddrMan *local_208;
  CNode *local_200 [3];
  direct_or_indirect local_1e8;
  Network local_1d8;
  pointer local_1d0;
  direct_or_indirect local_1c8;
  uint local_1b8;
  _Map_pointer local_1b0;
  undefined1 local_1a8 [8];
  CService local_1a0;
  direct_or_indirect local_178;
  undefined1 local_168 [24];
  path local_150;
  _List_node_base *local_128;
  _List_node_base *local_120;
  CNetAddr local_118;
  undefined2 local_f8;
  undefined8 local_f0;
  atomic<long> local_e8;
  undefined1 local_e0 [40];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  shared_count sStack_98;
  _Map_pointer local_90;
  uint16_t local_88;
  direct_or_indirect local_80;
  uint local_70;
  path local_60;
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  local_268._M_device = &NetEventsInterface::g_msgproc_mutex.super_mutex;
  local_268._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_268);
  ArgsManager::GetDataDir
            ((path *)&local_60,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
              super_BasicTestingSetup.m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_60,7,"banlist");
  std::filesystem::__cxx11::path::path((path *)&local_238.indirect_contents,&local_60);
  pCVar5 = (ChainstateManager *)operator_new(0xf0);
  std::filesystem::__cxx11::path::path
            ((path *)(local_168 + 0x18),(path *)&local_238.indirect_contents);
  ban_file.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff8cc;
  ban_file.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff8c8;
  ban_file.super_path._M_pathname._M_string_length = in_stack_fffffffffffff8d0;
  ban_file.super_path._M_pathname.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff8d8;
  ban_file.super_path._M_pathname.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff8dc;
  ban_file.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffff8e0;
  ban_file.super_path._M_pathname.field_2._12_4_ = in_stack_fffffffffffff8e4;
  ban_file.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_1_ =
       in_stack_fffffffffffff8e8;
  ban_file.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._1_7_ =
       in_stack_fffffffffffff8e9;
  BanMan::BanMan((BanMan *)pCVar5,ban_file,(CClientUIInterface *)(local_168 + 0x18),0);
  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)
       (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)pCVar5;
  std::filesystem::__cxx11::path::~path((path *)(local_168 + 0x18));
  std::filesystem::__cxx11::path::~path((path *)&local_238.indirect_contents);
  std::filesystem::__cxx11::path::~path(&local_60);
  addrman_in = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.addrman._M_t.
               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  netgroupman = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                super_BasicTestingSetup.m_node.netgroupman._M_t.
                super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
                .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  pCVar6 = Params();
  this_00 = (CConnman *)operator_new(0x488);
  CConnman::CConnman(this_00,0x1337,0x1337,addrman_in,netgroupman,pCVar6,true);
  pCVar5 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chainman._M_t.
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  warnings = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  local_278 = 0;
  uStack_274 = 100;
  uStack_270 = 100;
  uStack_26c = 0;
  _cVar13 = (check_type)((ulong)CONCAT42(100,uStack_276) << 0x10);
  uVar12 = (uint)(CONCAT26(uStack_26a,100) >> 0x20);
  opts._8_8_ = (undefined8)_cVar13;
  opts._0_8_ = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  local_2b8._8_8_ = this_00;
  PeerManager::make((CConnman *)local_2b8,(AddrMan *)this_00,
                    (BanMan *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (ChainstateManager *)
                    local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                    super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CTxMemPool *)pCVar5,
                    (Warnings *)warnings,opts);
  CNetAddr::CNetAddr((CNetAddr *)&local_80.indirect_contents);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x135;
  file.m_begin = (iterator)&local_2c8;
  msg.m_end = (iterator)warnings;
  msg.m_begin = (iterator)pCVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2d8,msg);
  paVar1 = &local_150._M_pathname.field_2;
  local_150._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_168 + 0x18),
             "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion","");
  local_a8[0] = CNetAddr::SetSpecial
                          ((CNetAddr *)&local_80.indirect_contents,(string *)(local_168 + 0x18));
  local_a8._8_8_ = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_2a0 = 
  "tor_netaddr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\")";
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0xe8681c;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_2e0 = "";
  local_220 = (CAddress *)&local_2a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_a8,(lazy_ostream *)&local_238.indirect_contents,2,0,WARN,
             _cVar13,(size_t)&local_2e8,0x135);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_pathname._M_dataplus._M_p,
                    local_150._M_pathname.field_2._M_allocated_capacity + 1);
  }
  pCVar6 = Params();
  CService::CService((CService *)local_a8,(CNetAddr *)&local_80.indirect_contents,
                     pCVar6->nDefaultPort);
  ip((CService *)&local_178.indirect_contents,0xa0b0c001);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)(local_168 + 0x18),
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178.indirect_contents);
  local_150._M_pathname.field_2._8_8_ = local_168._8_8_;
  local_150._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_2_ =
       local_168._16_2_;
  local_128 = (_List_node_base *)0x5f5e100;
  local_120 = (_List_node_base *)0x0;
  ip(&local_1a0,0xa0b0c002);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_118.m_addr,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0);
  node_opts = (CNodeOptions *)local_e0;
  local_118.m_net = local_1a0.super_CNetAddr.m_net;
  local_118.m_scope_id = local_1a0.super_CNetAddr.m_scope_id;
  local_f8 = local_1a0.port;
  local_f0 = (__pthread_internal_list *)0x5f5e100;
  local_e8.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  local_1b0 = local_90;
  local_1a8._0_2_ = local_88;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)node_opts,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents);
  local_e0._24_8_ = local_1b0;
  local_e0._32_2_ = local_1a8._0_2_;
  local_b8._0_8_ = 100000000;
  local_b8._8_8_ = (_Base_ptr)0x0;
  if (0x10 < local_1b8) {
    free(local_1c8.indirect_contents.indirect);
    local_1c8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1a0.super_CNetAddr.m_addr._size) {
    free(local_1a0.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    local_1a0.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)local_168._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  ip((CService *)&local_238.indirect_contents,0xa0b0ff01);
  local_1e8._8_8_ = CONCAT71(local_238._9_7_,local_238.direct[8]);
  local_1e8.indirect_contents.indirect = local_238.indirect_contents.indirect;
  local_1d8 = (Network)local_228;
  local_1d0 = (pointer)local_220;
  BanMan::ClearBanned((BanMan *)
                      local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>.
                      _M_t.super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                      super__Head_base<0UL,_BanMan_*,_false>._M_head_impl);
  pCVar7 = (CNode *)operator_new(0x3a8);
  local_2f8 = (undefined1  [8])0x0;
  p_Stack_2f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)&local_238.indirect_contents);
  local_210._0_1_ = false;
  local_210._1_7_ = 0x5f5e1;
  local_208 = (AddrMan *)0x0;
  local_258._0_8_ = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258);
  local_2a0 = (char *)((ulong)local_2a0 & 0xffffffff00000000);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = _Stack_290._M_i & 0xffffffffffffff00;
  local_288 = 5000000;
  local_280 = 0;
  pvVar9 = (iterator)0x0;
  pvVar10 = (iterator)0x0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 0x18);
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_2f8;
  pCVar11 = (CAddress *)local_258;
  CNode::CNode(pCVar7,0,sock,(CAddress *)0x0,0,(uint64_t)&local_238,(CAddress *)local_258,
               (string *)((ulong)uVar12 << 0x20),INBOUND,SUB81((pointer)&local_2a0,0),node_opts);
  local_200[0] = pCVar7;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            (&local_298);
  if ((pointer)local_258._0_8_ != (pointer)local_248) {
    operator_delete((void *)local_258._0_8_,
                    (ulong)((long)&((NetPermissions *)local_248._0_8_)->m_flags + 1));
  }
  if (0x10 < (Network)local_228) {
    free(local_238.indirect_contents.indirect);
  }
  if (p_Stack_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2f0);
  }
  pCVar2 = local_200[0];
  LOCK();
  (pCVar7->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)(local_2b8._0_8_ + 8))((long *)(local_2b8._0_8_ + 8),local_200[0],1);
  LOCK();
  (pCVar2->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode((ConnmanTestMsg *)local_2b8._8_8_,pCVar2);
  (**(code **)(*(long *)local_2b8._0_8_ + 0x98))(local_2b8._0_8_,pCVar2->id);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x150;
  file_00.m_begin = (iterator)&local_308;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
             msg_00);
  cVar3 = (**(code **)(*(long *)(local_2b8._0_8_ + 8) + 0x20))((long *)(local_2b8._0_8_ + 8),pCVar2)
  ;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "peerLogic->SendMessages(nodes[0])";
  local_258._8_8_ = (long)"peerLogic->SendMessages(nodes[0])" + 0x21;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_320 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  local_2a0._0_1_ = cVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_328,0x150);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x152;
  file_01.m_begin = (iterator)&local_338;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_348,
             msg_01);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)(local_168 + 0x18)
                 );
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[0])";
  local_258._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_350 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_358,0x152);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x153;
  file_02.m_begin = (iterator)&local_368;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
             msg_02);
  local_2a0._0_1_ = (pCVar2->fDisconnect)._M_base._M_i & 1;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[0]->fDisconnect";
  local_258._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_380 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_388,0x153);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x154;
  file_03.m_begin = (iterator)&local_398;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a8,
             msg_03);
  bVar4 = BanMan::IsDiscouraged
                    ((BanMan *)
                     local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t
                     .super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                     super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,
                     (CNetAddr *)&local_1e8.indirect_contents);
  local_2a0 = (char *)CONCAT71(local_2a0._1_7_,!bVar4);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "!banman->IsDiscouraged(other_addr)";
  local_258._8_8_ = (long)"!banman->IsDiscouraged(other_addr)" + 0x22;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3b0 = "";
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_3b8,0x154);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  pCVar7 = (CNode *)operator_new(0x3a8);
  local_3c8 = (undefined1  [8])0x0;
  p_Stack_3c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)&local_238.indirect_contents);
  local_210._0_1_ = false;
  local_210._1_7_ = 0x5f5e1;
  local_208 = (AddrMan *)0x0;
  local_258._0_8_ = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  local_2a0 = (char *)((ulong)local_2a0 & 0xffffffff00000000);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = _Stack_290._M_i & 0xffffffffffffff00;
  local_288 = 5000000;
  local_280 = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x1;
  sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_118;
  sock_00.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_3c8;
  pCVar11 = (CAddress *)local_258;
  CNode::CNode(pCVar7,1,sock_00,(CAddress *)0x1,1,(uint64_t)&local_238,(CAddress *)local_258,
               (string *)((ulong)uVar12 << 0x20),INBOUND,SUB81((assertion_result *)&local_2a0,0),
               node_opts);
  local_200[1] = pCVar7;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            (&local_298);
  if ((pointer)local_258._0_8_ != (pointer)local_248) {
    operator_delete((void *)local_258._0_8_,
                    (ulong)((long)&((NetPermissions *)local_248._0_8_)->m_flags + 1));
  }
  if (0x10 < (Network)local_228) {
    free(local_238.indirect_contents.indirect);
  }
  if (p_Stack_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3c0);
  }
  pCVar2 = local_200[1];
  LOCK();
  (pCVar7->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)(local_2b8._0_8_ + 8))((long *)(local_2b8._0_8_ + 8),local_200[1],1);
  LOCK();
  (pCVar2->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode((ConnmanTestMsg *)local_2b8._8_8_,pCVar2);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x163;
  file_04.m_begin = (iterator)&local_3d8;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3e8,
             msg_04);
  cVar3 = (**(code **)(*(long *)(local_2b8._0_8_ + 8) + 0x20))((long *)(local_2b8._0_8_ + 8),pCVar2)
  ;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "peerLogic->SendMessages(nodes[1])";
  local_258._8_8_ = (long)"peerLogic->SendMessages(nodes[1])" + 0x21;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_3f0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  local_2a0._0_1_ = cVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_3f8,0x163);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x165;
  file_05.m_begin = (iterator)&local_408;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_418,
             msg_05);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)(local_168 + 0x18)
                 );
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[0])";
  local_258._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_420 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_428,0x165);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x166;
  file_06.m_begin = (iterator)&local_438;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_448,
             msg_06);
  local_2a0._0_1_ = (local_200[0]->fDisconnect)._M_base._M_i & 1;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[0]->fDisconnect";
  local_258._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_450 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_458,0x166);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x168;
  file_07.m_begin = (iterator)&local_468;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_478,
             msg_07);
  bVar4 = BanMan::IsDiscouraged
                    ((BanMan *)
                     local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t
                     .super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                     super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,&local_118);
  local_2a0._0_1_ = !bVar4;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "!banman->IsDiscouraged(addr[1])";
  local_258._8_8_ = (long)"!banman->IsDiscouraged(addr[1])" + 0x1f;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_480 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_488,0x168);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x169;
  file_08.m_begin = (iterator)&local_498;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4a8,
             msg_08);
  local_2a0._0_1_ = ~(local_200[1]->fDisconnect)._M_base._M_i & 1;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "!nodes[1]->fDisconnect";
  local_258._8_8_ = (long)"!nodes[1]->fDisconnect" + 0x16;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4b0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_4b8,0x169);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  pCVar7 = local_200[1];
  (**(code **)(*(long *)local_2b8._0_8_ + 0x98))(local_2b8._0_8_,local_200[1]->id);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x16b;
  file_09.m_begin = (iterator)&local_4c8;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4d8,
             msg_09);
  local_2a0._0_1_ =
       (**(code **)(*(long *)(local_2b8._0_8_ + 8) + 0x20))((long *)(local_2b8._0_8_ + 8),pCVar7);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "peerLogic->SendMessages(nodes[1])";
  local_258._8_8_ = (long)"peerLogic->SendMessages(nodes[1])" + 0x21;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4e0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_4e8,0x16b);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x16d;
  file_10.m_begin = (iterator)&local_4f8;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_508,
             msg_10);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)(local_168 + 0x18)
                 );
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[0])";
  local_258._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_510 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_518,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x16e;
  file_11.m_begin = (iterator)&local_528;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_538,
             msg_11);
  local_2a0._0_1_ = (local_200[0]->fDisconnect)._M_base._M_i & 1;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[0]->fDisconnect";
  local_258._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_540 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_548,0x16e);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x16f;
  file_12.m_begin = (iterator)&local_558;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_568,
             msg_12);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,&local_118);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[1])";
  local_258._8_8_ = (long)"!banman->IsDiscouraged(addr[1])" + 0x1f;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_570 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_578,0x16f);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x170;
  file_13.m_begin = (iterator)&local_588;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_598,
             msg_13);
  local_2a0 = (char *)(CONCAT71(local_2a0._1_7_,(local_200[1]->fDisconnect)._M_base._M_i) &
                      0xffffffffffffff01);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[1]->fDisconnect";
  local_258._8_8_ = (long)"!nodes[1]->fDisconnect" + 0x16;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5a0 = "";
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_5a8,0x170);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  pCVar7 = (CNode *)operator_new(0x3a8);
  local_5b8 = (undefined1  [8])0x0;
  p_Stack_5b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)&local_238.indirect_contents);
  local_210._0_1_ = false;
  local_210._1_7_ = 0x5f5e1;
  local_208 = (AddrMan *)0x0;
  local_258._0_8_ = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  local_2a0 = (char *)((ulong)local_2a0 & 0xffffffff00000000);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = _Stack_290._M_i & 0xffffffffffffff00;
  local_288 = 5000000;
  local_280 = 0;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x1;
  sock_01.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0;
  sock_01.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_5b8;
  pCVar11 = (CAddress *)local_258;
  CNode::CNode(pCVar7,2,sock_01,(CAddress *)0x1,1,(uint64_t)&local_238,(CAddress *)local_258,
               (string *)CONCAT44(uVar12,1),INBOUND,SUB81((assertion_result *)&local_2a0,0),
               node_opts);
  local_200[2] = pCVar7;
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            (&local_298);
  if ((pointer)local_258._0_8_ != (pointer)local_248) {
    operator_delete((void *)local_258._0_8_,
                    (ulong)((long)&((NetPermissions *)local_248._0_8_)->m_flags + 1));
  }
  if (0x10 < (Network)local_228) {
    free(local_238.indirect_contents.indirect);
  }
  if (p_Stack_5b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5b0);
  }
  pCVar2 = local_200[2];
  LOCK();
  (pCVar7->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)(local_2b8._0_8_ + 8))((long *)(local_2b8._0_8_ + 8),local_200[2],1);
  LOCK();
  (pCVar2->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode((ConnmanTestMsg *)local_2b8._8_8_,pCVar2);
  (**(code **)(*(long *)local_2b8._0_8_ + 0x98))(local_2b8._0_8_,pCVar2->id);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x182;
  file_14.m_begin = (iterator)&local_5c8;
  msg_14.m_end = pvVar10;
  msg_14.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5d8,
             msg_14);
  cVar3 = (**(code **)(*(long *)(local_2b8._0_8_ + 8) + 0x20))((long *)(local_2b8._0_8_ + 8),pCVar2)
  ;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "peerLogic->SendMessages(nodes[2])";
  local_258._8_8_ = (long)"peerLogic->SendMessages(nodes[2])" + 0x21;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5e0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  local_2a0._0_1_ = cVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_5e8,0x182);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x183;
  file_15.m_begin = (iterator)&local_5f8;
  msg_15.m_end = pvVar10;
  msg_15.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_608,
             msg_15);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)(local_168 + 0x18)
                 );
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[0])";
  local_258._8_8_ = (long)"banman->IsDiscouraged(addr[0])" + 0x1e;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_610 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_618,0x183);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x184;
  file_16.m_begin = (iterator)&local_628;
  msg_16.m_end = pvVar10;
  msg_16.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_638,
             msg_16);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,&local_118);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[1])";
  local_258._8_8_ = (long)"!banman->IsDiscouraged(addr[1])" + 0x1f;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_640 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_648,0x184);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x185;
  file_17.m_begin = (iterator)&local_658;
  msg_17.m_end = pvVar10;
  msg_17.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_668,
             msg_17);
  local_2a0._0_1_ =
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_2a8._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,(CNetAddr *)local_e0);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "banman->IsDiscouraged(addr[2])";
  local_258._8_8_ = (long)"banman->IsDiscouraged(addr[2])" + 0x1e;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_670 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_678,0x185);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x186;
  file_18.m_begin = (iterator)&local_688;
  msg_18.m_end = pvVar10;
  msg_18.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_698,
             msg_18);
  local_2a0._0_1_ = (local_200[0]->fDisconnect)._M_base._M_i & 1;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[0]->fDisconnect";
  local_258._8_8_ = (long)"nodes[0]->fDisconnect" + 0x15;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6a0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_6a8,0x186);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x187;
  file_19.m_begin = (iterator)&local_6b8;
  msg_19.m_end = pvVar10;
  msg_19.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6c8,
             msg_19);
  local_2a0._0_1_ = (local_200[1]->fDisconnect)._M_base._M_i & 1;
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[1]->fDisconnect";
  local_258._8_8_ = (long)"!nodes[1]->fDisconnect" + 0x16;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6d0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_6d8,0x187);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x188;
  file_20.m_begin = (iterator)&local_6e8;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_6f8,
             msg_20);
  local_2a0 = (char *)(CONCAT71(local_2a0._1_7_,(local_200[2]->fDisconnect)._M_base._M_i) &
                      0xffffffffffffff01);
  local_298._M_t.super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>.
  _M_t.super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (__uniq_ptr_data<i2p::sam::Session,_std::default_delete<i2p::sam::Session>,_true,_true>)
       (__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>)0x0;
  _Stack_290._M_i = 0;
  local_258._0_8_ = "nodes[2]->fDisconnect";
  local_258._8_8_ = (long)"nodes[2]->fDisconnect" + 0x15;
  local_238.direct[8] = '\0';
  local_238.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_700 = "";
  local_220 = (CAddress *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2a0,(lazy_ostream *)&local_238.indirect_contents,1,0,WARN,
             (check_type)pCVar11,(size_t)&local_708,0x188);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_290);
  lVar8 = 0;
  do {
    (**(code **)(*(long *)(local_2b8._0_8_ + 8) + 8))
              ((long *)(local_2b8._0_8_ + 8),*(undefined8 *)((long)local_200 + lVar8));
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x18);
  ConnmanTestMsg::ClearTestNodes((ConnmanTestMsg *)local_2b8._8_8_);
  if (0x10 < local_1d8) {
    free(local_1e8.indirect_contents.indirect);
  }
  lVar8 = 0x70;
  do {
    if (0x10 < *(uint *)((long)&local_150._M_pathname.field_2 + lVar8)) {
      free(*(void **)(local_168 + lVar8 + 0x18));
      *(undefined8 *)(local_168 + lVar8 + 0x18) = 0;
    }
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != -0x38);
  if (0x10 < (uint)sStack_98.pi_) {
    free((void *)CONCAT71(local_a8._1_7_,local_a8[0]));
  }
  if (0x10 < local_70) {
    free(local_80.indirect_contents.indirect);
  }
  if ((long *)local_2b8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_2b8._0_8_ + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)(local_2b8 + 8));
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::~unique_ptr(&local_2a8);
  std::unique_lock<std::mutex>::~unique_lock(&local_268);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(peer_discouragement)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    CNetAddr tor_netaddr;
    BOOST_REQUIRE(
        tor_netaddr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"));
    const CService tor_service{tor_netaddr, Params().GetDefaultPort()};

    const std::array<CAddress, 3> addr{CAddress{ip(0xa0b0c001), NODE_NONE},
                                       CAddress{ip(0xa0b0c002), NODE_NONE},
                                       CAddress{tor_service, NODE_NONE}};

    const CNetAddr other_addr{ip(0xa0b0ff01)}; // Not any of addr[].

    std::array<CNode*, 3> nodes;

    banman->ClearBanned();
    NodeId id{0};
    nodes[0] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[0],
                         /*nKeyedNetGroupIn=*/0,
                         /*nLocalHostNonceIn=*/0,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::INBOUND,
                         /*inbound_onion=*/false};
    nodes[0]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[0], NODE_NETWORK);
    nodes[0]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[0]);
    peerLogic->UnitTestMisbehaving(nodes[0]->GetId()); // Should be discouraged
    BOOST_CHECK(peerLogic->SendMessages(nodes[0]));

    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(!banman->IsDiscouraged(other_addr)); // Different address, not discouraged

    nodes[1] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[1],
                         /*nKeyedNetGroupIn=*/1,
                         /*nLocalHostNonceIn=*/1,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::INBOUND,
                         /*inbound_onion=*/false};
    nodes[1]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[1], NODE_NETWORK);
    nodes[1]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[1]);
    BOOST_CHECK(peerLogic->SendMessages(nodes[1]));
    // [0] is still discouraged/disconnected.
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    // [1] is not discouraged/disconnected yet.
    BOOST_CHECK(!banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(!nodes[1]->fDisconnect);
    peerLogic->UnitTestMisbehaving(nodes[1]->GetId());
    BOOST_CHECK(peerLogic->SendMessages(nodes[1]));
    // Expect both [0] and [1] to be discouraged/disconnected now.
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(nodes[1]->fDisconnect);

    // Make sure non-IP peers are discouraged and disconnected properly.

    nodes[2] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[2],
                         /*nKeyedNetGroupIn=*/1,
                         /*nLocalHostNonceIn=*/1,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::OUTBOUND_FULL_RELAY,
                         /*inbound_onion=*/false};
    nodes[2]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[2], NODE_NETWORK);
    nodes[2]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[2]);
    peerLogic->UnitTestMisbehaving(nodes[2]->GetId());
    BOOST_CHECK(peerLogic->SendMessages(nodes[2]));
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(banman->IsDiscouraged(addr[2]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(nodes[1]->fDisconnect);
    BOOST_CHECK(nodes[2]->fDisconnect);

    for (CNode* node : nodes) {
        peerLogic->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}